

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true,_true,_false>_>_>
::_reduce(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true,_true,_false>_>_>
          *this)

{
  bool bVar1;
  Index i;
  uint columnIndex;
  
  for (columnIndex = 0; columnIndex < (uint)(this->reducedMatrixR_).matrix_._M_h._M_element_count;
      columnIndex = columnIndex + 1) {
    bVar1 = Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true,_true,_false>_>_>
            ::is_zero_column(&this->reducedMatrixR_,columnIndex);
    if (bVar1) {
      Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true,_true,_false>_>_>
      ::get_column_dimension(&this->reducedMatrixR_,columnIndex);
    }
    else {
      _reduce_column(this,columnIndex,columnIndex);
    }
  }
  return;
}

Assistant:

inline void RU_matrix<Master_matrix>::_reduce()
{
  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    _indexToBar().reserve(reducedMatrixR_.get_number_of_columns());
  }

  for (Index i = 0; i < reducedMatrixR_.get_number_of_columns(); i++) {
    if (!(reducedMatrixR_.is_zero_column(i))) {
      _reduce_column(i, i);
    } else {
      _add_bar(get_column_dimension(i), i);
    }
  }
}